

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metee_linux.c
# Opt level: O0

TEESTATUS TeeInitFull(PTEEHANDLE handle,GUID *guid,tee_device_address device,uint32_t log_level,
                     TeeLogCallback log_callback)

{
  int iVar1;
  uint uVar2;
  uuid_le *guid_00;
  mei *me;
  mei_log_callback in_RCX;
  uint in_EDX;
  uuid_le *in_RSI;
  char *in_RDI;
  bool bVar3;
  _Bool verbose;
  int rc;
  TEESTATUS status;
  metee_linux_intl *intl;
  mei *in_stack_ffffffffffffff98;
  mei *me_00;
  uint local_38;
  TEESTATUS local_32;
  _Bool verbose_00;
  uchar req_protocol_version;
  undefined6 in_stack_fffffffffffffff8;
  undefined2 in_stack_fffffffffffffffe;
  
  me_00 = (mei *)&stack0x00000008;
  bVar3 = in_EDX == 2;
  if ((in_RSI == (uuid_le *)0x0) || (in_RDI == (char *)0x0)) {
    return 4;
  }
  __tee_init_handle((PTEEHANDLE)0x12c065);
  uVar2 = in_EDX;
  if (2 < in_EDX) {
    uVar2 = 2;
  }
  *(uint *)(in_RDI + 0x14) = uVar2;
  *(mei_log_callback *)(in_RDI + 0x18) = in_RCX;
  if ((in_RDI != (char *)0x0) && (1 < *(uint *)(in_RDI + 0x14))) {
    if (*(long *)(in_RDI + 0x18) == 0) {
      syslog(7,"TEELIB: (%s:%s():%d) Entry\n",
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
             ,"TeeInitFull",0x70);
    }
    else {
      (**(code **)(in_RDI + 0x18))
                (0,"TEELIB: (%s:%s():%d) Entry\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                 ,"TeeInitFull",0x70);
    }
  }
  if (in_EDX < 3) {
    guid_00 = (uuid_le *)(ulong)*(uint *)(me_00->guid).b;
    switch(guid_00) {
    case (uuid_le *)0x0:
      if (*(long *)((me_00->guid).b + 8) != 0) {
        if ((in_RDI != (char *)0x0) && (*(int *)(in_RDI + 0x14) != 0)) {
          if (*(long *)(in_RDI + 0x18) == 0) {
            syslog(3,"TEELIB: (%s:%s():%d) Path is not NULL.\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                   ,"TeeInitFull",0x7a);
          }
          else {
            (**(code **)(in_RDI + 0x18))
                      (1,"TEELIB: (%s:%s():%d) Path is not NULL.\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                       ,"TeeInitFull",0x7a);
          }
        }
        return 4;
      }
      break;
    case (uuid_le *)0x1:
      if (*(long *)((me_00->guid).b + 8) == 0) {
        if ((in_RDI != (char *)0x0) && (*(int *)(in_RDI + 0x14) != 0)) {
          if (*(long *)(in_RDI + 0x18) == 0) {
            syslog(3,"TEELIB: (%s:%s():%d) Path is NULL.\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                   ,"TeeInitFull",0x81);
          }
          else {
            (**(code **)(in_RDI + 0x18))
                      (1,"TEELIB: (%s:%s():%d) Path is NULL.\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                       ,"TeeInitFull",0x81);
          }
        }
        return 4;
      }
      break;
    case (uuid_le *)0x2:
      if (*(int *)((me_00->guid).b + 8) == -1) {
        if ((in_RDI != (char *)0x0) && (*(int *)(in_RDI + 0x14) != 0)) {
          if (*(long *)(in_RDI + 0x18) == 0) {
            syslog(3,"TEELIB: (%s:%s():%d) Handle is invalid.\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                   ,"TeeInitFull",0x88);
          }
          else {
            (**(code **)(in_RDI + 0x18))
                      (1,"TEELIB: (%s:%s():%d) Handle is invalid.\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                       ,"TeeInitFull",0x88);
          }
        }
        return 4;
      }
      break;
    case (uuid_le *)0x3:
    default:
      if ((in_RDI != (char *)0x0) && (*(int *)(in_RDI + 0x14) != 0)) {
        if (*(long *)(in_RDI + 0x18) == 0) {
          syslog(3,"TEELIB: (%s:%s():%d) Wrong device type %u.\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                 ,"TeeInitFull",0x8f,(ulong)*(uint *)(me_00->guid).b);
        }
        else {
          (**(code **)(in_RDI + 0x18))
                    (1,"TEELIB: (%s:%s():%d) Wrong device type %u.\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                     ,"TeeInitFull",0x8f,*(undefined4 *)(me_00->guid).b);
        }
      }
      return 4;
    }
    me = (mei *)malloc(0x50);
    if (me == (mei *)0x0) {
      if ((in_RDI != (char *)0x0) && (*(int *)(in_RDI + 0x14) != 0)) {
        if (*(long *)(in_RDI + 0x18) == 0) {
          syslog(3,"TEELIB: (%s:%s():%d) Cannot alloc intl structure\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                 ,"TeeInitFull",0x96);
        }
        else {
          (**(code **)(in_RDI + 0x18))
                    (1,"TEELIB: (%s:%s():%d) Cannot alloc intl structure\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                     ,"TeeInitFull",0x96);
        }
      }
      local_32 = 1;
    }
    else {
      iVar1 = *(int *)(me_00->guid).b;
      verbose_00 = SUB41(in_EDX >> 0x10,0);
      req_protocol_version = (uchar)(in_EDX >> 0x18);
      if (iVar1 == 0) {
        local_38 = mei_init_with_log((mei *)CONCAT26(in_stack_fffffffffffffffe,
                                                     in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                     req_protocol_version,verbose_00,in_RCX);
      }
      else if (iVar1 == 1) {
        local_38 = mei_init_with_log((mei *)CONCAT26(in_stack_fffffffffffffffe,
                                                     in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                     req_protocol_version,verbose_00,in_RCX);
      }
      else if (iVar1 == 2) {
        local_38 = mei_init_fd(me_00,uVar2,guid_00,'\0',false);
        if (local_38 == 0) {
          mei_set_log_callback(in_stack_ffffffffffffff98,(mei_log_callback)0x12c58c);
          mei_set_log_level(me,(uint)bVar3);
        }
      }
      else {
        local_38 = 0xfffffff2;
      }
      if (local_38 == 0) {
        uVar2 = pipe((int *)(me + 1));
        if (uVar2 == 0) {
          *(mei **)in_RDI = me;
          local_32 = 0;
        }
        else {
          mei_deinit((mei *)0x12c67b);
          free(me);
          if ((in_RDI != (char *)0x0) && (*(int *)(in_RDI + 0x14) != 0)) {
            if (*(long *)(in_RDI + 0x18) == 0) {
              syslog(3,"TEELIB: (%s:%s():%d) Cannot init mei, rc = %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                     ,"TeeInitFull",0xb9,(ulong)uVar2);
            }
            else {
              (**(code **)(in_RDI + 0x18))
                        (1,"TEELIB: (%s:%s():%d) Cannot init mei, rc = %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                         ,"TeeInitFull",0xb9,uVar2);
            }
          }
          local_32 = errno2status_init((long)(int)uVar2);
        }
      }
      else {
        free(me);
        if ((in_RDI != (char *)0x0) && (*(int *)(in_RDI + 0x14) != 0)) {
          if (*(long *)(in_RDI + 0x18) == 0) {
            syslog(3,"TEELIB: (%s:%s():%d) Cannot init mei, rc = %d\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                   ,"TeeInitFull",0xb1,(ulong)local_38);
          }
          else {
            (**(code **)(in_RDI + 0x18))
                      (1,"TEELIB: (%s:%s():%d) Cannot init mei, rc = %d\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                       ,"TeeInitFull",0xb1,local_38);
          }
        }
        local_32 = errno2status_init((long)(int)local_38);
      }
    }
    return local_32;
  }
  if ((in_RDI != (char *)0x0) && (*(int *)(in_RDI + 0x14) != 0)) {
    if (*(long *)(in_RDI + 0x18) == 0) {
      syslog(3,"TEELIB: (%s:%s():%d) LogLevel %u is too big.\n",
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
             ,"TeeInitFull",0x73,(ulong)in_EDX);
    }
    else {
      (**(code **)(in_RDI + 0x18))
                (1,"TEELIB: (%s:%s():%d) LogLevel %u is too big.\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/build_O0/metee/src/linux/metee_linux.c"
                 ,"TeeInitFull",0x73,in_EDX);
    }
  }
  return 4;
}

Assistant:

TEESTATUS TEEAPI TeeInitFull(IN OUT PTEEHANDLE handle, IN const GUID* guid,
			     IN const struct tee_device_address device,
			     IN uint32_t log_level, IN OPTIONAL TeeLogCallback log_callback)
{
	struct metee_linux_intl *intl;
	TEESTATUS  status;
	int rc;
	bool verbose = (log_level == TEE_LOG_LEVEL_VERBOSE);

	if (guid == NULL || handle == NULL) {
		return TEE_INVALID_PARAMETER;
	}

	__tee_init_handle(handle);
	handle->log_level = (log_level >= TEE_LOG_LEVEL_MAX) ? TEE_LOG_LEVEL_VERBOSE : log_level;
	handle->log_callback = log_callback;

	FUNC_ENTRY(handle);

	if (log_level >= TEE_LOG_LEVEL_MAX) {
		ERRPRINT(handle, "LogLevel %u is too big.\n", log_level);
		status = TEE_INVALID_PARAMETER;
		goto End;
	}
	switch (device.type) {
	case TEE_DEVICE_TYPE_NONE:
		if (device.data.path != NULL) {
			ERRPRINT(handle, "Path is not NULL.\n");
			status = TEE_INVALID_PARAMETER;
			goto End;
		}
		break;
	case TEE_DEVICE_TYPE_PATH:
		if (device.data.path == NULL) {
			ERRPRINT(handle, "Path is NULL.\n");
			status = TEE_INVALID_PARAMETER;
			goto End;
		}
		break;
	case TEE_DEVICE_TYPE_HANDLE:
		if (device.data.handle == TEE_INVALID_DEVICE_HANDLE) {
			ERRPRINT(handle, "Handle is invalid.\n");
			status = TEE_INVALID_PARAMETER;
			goto End;
		}
		break;
	case TEE_DEVICE_TYPE_GUID:
	default:
		ERRPRINT(handle, "Wrong device type %u.\n", device.type);
		status = TEE_INVALID_PARAMETER;
		goto End;
	}

	intl = malloc(sizeof(struct metee_linux_intl));
	if (!intl) {
		ERRPRINT(handle, "Cannot alloc intl structure\n");
		status = TEE_INTERNAL_ERROR;
		goto End;
	}

	switch (device.type) {
	case TEE_DEVICE_TYPE_NONE:
		rc = mei_init_with_log(&intl->me, MEI_DEFAULT_DEVICE,
			(uuid_le*)guid, 0, verbose, log_callback);
		break;
	case TEE_DEVICE_TYPE_PATH:
		rc = mei_init_with_log(&intl->me, device.data.path,
			(uuid_le*)guid, 0, verbose, log_callback);
		break;
	case TEE_DEVICE_TYPE_HANDLE:
		rc = mei_init_fd(&intl->me, device.data.handle, (uuid_le*)guid, 0, verbose);
		if (!rc) {
			mei_set_log_callback(&intl->me, log_callback);
			mei_set_log_level(&intl->me, verbose);
		}
		break;
	default:
		rc = -EFAULT;
		break;
	}
	if (rc) {
		free(intl);
		ERRPRINT(handle, "Cannot init mei, rc = %d\n", rc);
		status = errno2status_init(rc);
		goto End;
	}
	rc = pipe(intl->cancel_pipe);
	if (rc) {
		mei_deinit(&intl->me);
		free(intl);
		ERRPRINT(handle, "Cannot init mei, rc = %d\n", rc);
		status = errno2status_init(rc);
		goto End;
	}
	handle->handle = intl;

	status = TEE_SUCCESS;

End:
	return status;
}